

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::decode_code_point(uint8_t *buf,size_t buflen,uint32_t code)

{
  size_t sVar1;
  byte bVar2;
  
  if (buflen < 4) {
    decode_code_point();
  }
  bVar2 = (byte)code;
  if (code < 0x80) {
    *buf = bVar2;
    sVar1 = 1;
  }
  else if (code < 0x800) {
    *buf = (byte)(code >> 6) | 0xc0;
    buf[1] = bVar2 & 0x3f | 0x80;
    sVar1 = 2;
  }
  else if (code < 0x10000) {
    *buf = (byte)(code >> 0xc) | 0xe0;
    buf[1] = (byte)(code >> 6) & 0x3f | 0x80;
    buf[2] = bVar2 & 0x3f | 0x80;
    sVar1 = 3;
  }
  else if (code < 0x110000) {
    *buf = (byte)(code >> 0x12) | 0xf0;
    buf[1] = (byte)(code >> 0xc) & 0x3f | 0x80;
    buf[2] = (byte)(code >> 6) & 0x3f | 0x80;
    buf[3] = bVar2 & 0x3f | 0x80;
    sVar1 = 4;
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t decode_code_point(uint8_t *C4_RESTRICT buf, size_t buflen, const uint32_t code)
{
    C4_UNUSED(buflen);
    C4_ASSERT(buflen >= 4);
    if (code <= UINT32_C(0x7f))
    {
        buf[0] = (uint8_t)code;
        return 1u;
    }
    else if(code <= UINT32_C(0x7ff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xc0) | (code >> 6));             /* 110xxxxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | (code & UINT32_C(0x3f))); /* 10xxxxxx */
        return 2u;
    }
    else if(code <= UINT32_C(0xffff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xe0) | ((code >> 12)));                  /* 1110xxxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | ((code >>  6) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[2] = (uint8_t)(UINT32_C(0x80) | ((code      ) & UINT32_C(0x3f))); /* 10xxxxxx */
        return 3u;
    }
    else if(code <= UINT32_C(0x10ffff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xf0) | ((code >> 18)));                  /* 11110xxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | ((code >> 12) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[2] = (uint8_t)(UINT32_C(0x80) | ((code >>  6) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[3] = (uint8_t)(UINT32_C(0x80) | ((code      ) & UINT32_C(0x3f))); /* 10xxxxxx */
        return 4u;
    }
    return 0;
}